

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.hpp
# Opt level: O3

bool __thiscall Triangle::onsurface(Triangle *this,point *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  fVar7 = p->x;
  fVar12 = p->y;
  fVar1 = (this->v1).x;
  fVar2 = (this->v1).y;
  fVar14 = p->z;
  fVar3 = (this->v1).z;
  fVar4 = (this->v3).x;
  fVar5 = (this->v3).y;
  fVar6 = (this->v3).z;
  fVar16 = (this->v2).x;
  fVar17 = (this->v2).y;
  fVar8 = fVar16 - fVar1;
  fVar15 = (this->v2).z;
  fVar11 = fVar17 - fVar2;
  fVar13 = fVar15 - fVar3;
  auVar9._0_4_ = fVar8 * (fVar12 - fVar2);
  auVar9._4_4_ = (fVar4 - fVar16) * (fVar12 - fVar17);
  auVar9._8_4_ = (fVar12 - 0.0) * 0.0;
  auVar9._12_4_ = (fVar12 - 0.0) * 0.0;
  fVar19 = (fVar12 - fVar2) * fVar13 - fVar11 * (fVar14 - fVar3);
  fVar20 = (fVar12 - fVar17) * (fVar6 - fVar15) - (fVar5 - fVar17) * (fVar14 - fVar15);
  fVar21 = (fVar12 - 0.0) * 0.0 - (fVar14 - 0.0) * 0.0;
  fVar22 = (fVar12 - 0.0) * 0.0 - (fVar14 - 0.0) * 0.0;
  fVar23 = (fVar14 - fVar3) * fVar8 - fVar13 * (fVar7 - fVar1);
  fVar24 = (fVar14 - fVar15) * (fVar4 - fVar16) - (fVar6 - fVar15) * (fVar7 - fVar16);
  fVar25 = (fVar14 - 0.0) * 0.0 - (fVar7 - 0.0) * 0.0;
  fVar26 = (fVar14 - 0.0) * 0.0 - (fVar7 - 0.0) * 0.0;
  fVar15 = (fVar7 - fVar1) * fVar11 - auVar9._0_4_;
  fVar16 = (fVar7 - fVar16) * (fVar5 - fVar17) - auVar9._4_4_;
  fVar17 = (fVar7 - 0.0) * 0.0 - auVar9._8_4_;
  fVar18 = (fVar7 - 0.0) * 0.0 - auVar9._12_4_;
  auVar10._4_4_ = fVar16 * fVar16 + fVar20 * fVar20 + fVar24 * fVar24;
  auVar10._0_4_ = fVar15 * fVar15 + fVar19 * fVar19 + fVar23 * fVar23;
  auVar10._8_4_ = fVar17 * fVar17 + fVar21 * fVar21 + fVar25 * fVar25;
  auVar10._12_4_ = fVar18 * fVar18 + fVar22 * fVar22 + fVar26 * fVar26;
  auVar10 = sqrtps(auVar9,auVar10);
  fVar17 = (fVar12 - fVar5) * (fVar3 - fVar6) - (fVar2 - fVar5) * (fVar14 - fVar6);
  fVar16 = (fVar14 - fVar6) * (fVar1 - fVar4) - (fVar3 - fVar6) * (fVar7 - fVar4);
  fVar15 = (fVar2 - fVar5) * (fVar7 - fVar4) - (fVar1 - fVar4) * (fVar12 - fVar5);
  fVar12 = fVar11 * (fVar6 - fVar3) - (fVar5 - fVar2) * fVar13;
  fVar14 = fVar13 * (fVar4 - fVar1) - (fVar6 - fVar3) * fVar8;
  fVar7 = (fVar5 - fVar2) * fVar8 - (fVar4 - fVar1) * fVar11;
  return SQRT(fVar15 * fVar15 + fVar17 * fVar17 + fVar16 * fVar16) + auVar10._4_4_ + auVar10._0_4_ <
         SQRT(fVar7 * fVar7 + fVar12 * fVar12 + fVar14 * fVar14) * 1.0001;
}

Assistant:

inline vec3f operator - (const vec3f& a, const vec3f& b) {
	return vec3f(a.x - b.x, a.y - b.y, a.z - b.z);
}